

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinput.c
# Opt level: O1

xcb_void_cookie_t
xcb_input_change_device_property_checked
          (xcb_connection_t *c,xcb_atom_t property,xcb_atom_t type,uint8_t device_id,uint8_t format,
          uint8_t mode,uint32_t num_items,void *items)

{
  int iVar1;
  uint uVar2;
  long in_FS_OFFSET;
  undefined4 local_a8;
  xcb_atom_t xStack_a4;
  undefined8 uStack_a0;
  uint32_t local_98;
  xcb_input_change_device_property_items_t local_88;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  void *local_28;
  undefined1 *puStack_20;
  long local_18;
  
  local_48 = (undefined1 *)&local_a8;
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  _local_a8 = CONCAT44(property,0xaaaaaaaa);
  uStack_a0 = (ulong)CONCAT16(mode,CONCAT15(format,CONCAT14(device_id,type)));
  local_98 = num_items;
  uStack_40 = 0x14;
  local_38 = 0;
  uStack_30 = 0;
  local_28 = items;
  local_88.data32 = (uint32_t *)&DAT_aaaaaaaaaaaaaaaa;
  local_88.data8 = &DAT_aaaaaaaaaaaaaaaa;
  local_88.data16 = (uint16_t *)&DAT_aaaaaaaaaaaaaaaa;
  iVar1 = xcb_input_change_device_property_items_unpack(items,num_items,format,&local_88);
  puStack_20 = (undefined1 *)(long)iVar1;
  uVar2 = xcb_send_request(c,1,&local_48,&xcb_input_change_device_property_checked::xcb_req);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (xcb_void_cookie_t)uVar2;
  }
  __stack_chk_fail();
}

Assistant:

xcb_void_cookie_t
xcb_input_change_device_property_checked (xcb_connection_t *c,
                                          xcb_atom_t        property,
                                          xcb_atom_t        type,
                                          uint8_t           device_id,
                                          uint8_t           format,
                                          uint8_t           mode,
                                          uint32_t          num_items,
                                          const void       *items)
{
    static const xcb_protocol_request_t xcb_req = {
        .count = 3,
        .ext = &xcb_input_id,
        .opcode = XCB_INPUT_CHANGE_DEVICE_PROPERTY,
        .isvoid = 1
    };

    struct iovec xcb_parts[5];
    xcb_void_cookie_t xcb_ret;
    xcb_input_change_device_property_request_t xcb_out;

    xcb_out.property = property;
    xcb_out.type = type;
    xcb_out.device_id = device_id;
    xcb_out.format = format;
    xcb_out.mode = mode;
    xcb_out.pad0 = 0;
    xcb_out.num_items = num_items;

    xcb_parts[2].iov_base = (char *) &xcb_out;
    xcb_parts[2].iov_len = sizeof(xcb_out);
    xcb_parts[3].iov_base = 0;
    xcb_parts[3].iov_len = -xcb_parts[2].iov_len & 3;
    /* xcb_input_change_device_property_items_t items */
    xcb_parts[4].iov_base = (char *) items;
    xcb_parts[4].iov_len =
      xcb_input_change_device_property_items_sizeof (items, num_items, format);

    xcb_ret.sequence = xcb_send_request(c, XCB_REQUEST_CHECKED, xcb_parts + 2, &xcb_req);
    return xcb_ret;
}